

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall BotscriptParser::writeMemberBuffers(BotscriptParser *this)

{
  DataBuffer **ppDVar1;
  DataBuffer *pDVar2;
  DataBuffer **local_a0;
  DataBuffer **local_98;
  initializer_list<DataBuffer_**> local_90;
  _Deque_base<DataBuffer_**,_std::allocator<DataBuffer_**>_> local_80;
  
  if (this->m_gotMainLoop == false) {
    DataBuffer::writeHeader(this->m_mainLoopBuffer,MainLoop);
    DataBuffer::writeHeader(this->m_mainLoopBuffer,EndMainLoop);
  }
  local_90._M_array = &local_a0;
  local_90._M_len = 2;
  local_a0 = &this->m_onenterBuffer;
  local_98 = &this->m_mainLoopBuffer;
  List<DataBuffer_**>::List((List<DataBuffer_**> *)&local_80,&local_90);
  while (local_80._M_impl.super__Deque_impl_data._M_start._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pDVar2 = this->m_switchBuffer;
    if (pDVar2 == (DataBuffer *)0x0) {
      ppDVar1 = &this->m_onenterBuffer;
      if ((this->m_currentMode == Onenter) ||
         (ppDVar1 = &this->m_mainLoopBuffer, this->m_currentMode == MainLoop)) {
        pDVar2 = *ppDVar1;
      }
      else {
        pDVar2 = this->m_mainBuffer;
      }
    }
    ppDVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    DataBuffer::mergeAndDestroy(pDVar2,*ppDVar1);
    pDVar2 = (DataBuffer *)operator_new(0xb8);
    DataBuffer::DataBuffer(pDVar2,0x80);
    *ppDVar1 = pDVar2;
    local_80._M_impl.super__Deque_impl_data._M_start._M_cur =
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    if (local_80._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_last) {
      local_80._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_80._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_80._M_impl.super__Deque_impl_data._M_start._M_node =
           local_80._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      local_80._M_impl.super__Deque_impl_data._M_start._M_last =
           local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
    }
  }
  std::_Deque_base<DataBuffer_**,_std::allocator<DataBuffer_**>_>::~_Deque_base(&local_80);
  this->m_gotMainLoop = false;
  return;
}

Assistant:

void BotscriptParser::writeMemberBuffers()
{
	// If there was no mainloop defined, write a dummy one now.
	if (m_gotMainLoop == false)
	{
		m_mainLoopBuffer->writeHeader (DataHeader::MainLoop);
		m_mainLoopBuffer->writeHeader (DataHeader::EndMainLoop);
	}

	// Write the onenter and mainloop buffers, in that order in particular.
	for (DataBuffer** bufp : List<DataBuffer**> ({&m_onenterBuffer, &m_mainLoopBuffer}))
	{
		currentBuffer()->mergeAndDestroy (*bufp);

		// Clear the buffer afterwards for potential next state
		*bufp = new DataBuffer;
	}

	// Next state definitely has no mainloop yet
	m_gotMainLoop = false;
}